

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testInvalidParameterName(ErrorsTest *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar10;
  GLenum GVar11;
  GLuint query;
  GLuint buffer;
  GLuint local_1c8;
  GLuint local_1c4;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar9;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  GVar11 = 0;
  do {
    do {
      GVar11 = GVar11 + 1;
    } while (GVar11 == 0x8866);
    uVar2 = 0;
    do {
      uVar10 = uVar2;
      if (uVar10 == 3) break;
      uVar2 = uVar10 + 1;
    } while ((&DAT_01b0b514)[uVar10] != GVar11);
    if (2 < uVar10) {
      local_1c4 = 0;
      local_1c8 = 0;
      (**(code **)(lVar9 + 0x6c8))(1);
      dVar4 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar4,"glGenBuffers have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                      ,0x37d);
      (**(code **)(lVar9 + 0x40))(0x8c8e,local_1c4);
      dVar4 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar4,"glBindBuffers have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                      ,0x380);
      (**(code **)(lVar9 + 0x150))(0x8c8e,8,0,0x88ea);
      dVar4 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar4,"glBindBuffers have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                      ,899);
      (**(code **)(lVar9 + 0x3d8))(0x8914,1,&local_1c8);
      dVar4 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar4,"glCreateQueries have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                      ,0x387);
      (*this->m_pGetQueryBufferObjectiv)(local_1c8,local_1c4,GVar11,0);
      iVar3 = (**(code **)(lVar9 + 0x800))();
      if (iVar3 != 0x500) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glGetQueryBufferObjectiv called with invalid parameter name has generated error "
                   ,0x50);
        local_1c0.m_getName = glu::getErrorName;
        local_1c0.m_value = iVar3;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,", however GL_INVALID_ENUM was expected.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      (*this->m_pGetQueryBufferObjectuiv)(local_1c8,local_1c4,GVar11,0);
      iVar5 = (**(code **)(lVar9 + 0x800))();
      if (iVar5 != 0x500) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glGetQueryBufferObjectuiv called with invalid parameter name has generated error "
                   ,0x51);
        local_1c0.m_getName = glu::getErrorName;
        local_1c0.m_value = iVar5;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,", however GL_INVALID_ENUM was expected.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      (*this->m_pGetQueryBufferObjecti64v)(local_1c8,local_1c4,GVar11,0);
      iVar6 = (**(code **)(lVar9 + 0x800))();
      if (iVar6 != 0x500) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glGetQueryBufferObjecti64v called with invalid parameter name has generated error "
                   ,0x52);
        local_1c0.m_getName = glu::getErrorName;
        local_1c0.m_value = iVar6;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,", however GL_INVALID_ENUM was expected.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      (*this->m_pGetQueryBufferObjectui64v)(local_1c8,local_1c4,GVar11,0);
      iVar7 = (**(code **)(lVar9 + 0x800))();
      if (iVar7 != 0x500) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glGetQueryBufferObjectui64v called with invalid parameter name has generated error "
                   ,0x53);
        local_1c0.m_getName = glu::getErrorName;
        local_1c0.m_value = iVar7;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,", however GL_INVALID_ENUM was expected.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      if (local_1c8 != 0) {
        (**(code **)(lVar9 + 0x458))(1,&local_1c8);
      }
      if (local_1c4 != 0) {
        (**(code **)(lVar9 + 0x438))(1,&local_1c4);
      }
      do {
        iVar8 = (**(code **)(lVar9 + 0x800))();
      } while (iVar8 != 0);
      return iVar7 == 0x500 && (iVar6 == 0x500 && (iVar5 == 0x500 && iVar3 == 0x500));
    }
  } while( true );
}

Assistant:

bool ErrorsTest::testInvalidParameterName()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating invalid parameter name. */
	glw::GLuint invalid_pname = 0;

	while (isParameterName(++invalid_pname))
		;

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test's objects. */
	glw::GLuint buffer = 0;
	glw::GLuint query  = 0;

	try
	{
		/* Creating buffer for the test. */
		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLint64), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query of invalid parameter name (integer version). */
		m_pGetQueryBufferObjectiv(query, buffer, invalid_pname, 0);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid parameter name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, buffer, invalid_pname, 0);

		error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid parameter name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, buffer, invalid_pname, 0);

		error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid parameter name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, buffer, invalid_pname, 0);

		error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.deleteQueries(1, &query);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}